

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O3

void json::JsonParser::parseObject(istream *input,JsonObject *parent)

{
  runtime_error *this;
  JsonToken current;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  JsonLexer::nextToken((JsonToken *)local_58,input);
  if (local_58._0_4_ != EndObject) {
    parseObjectMember(input,(JsonToken *)local_58,parent);
    JsonLexer::nextToken((JsonToken *)local_80,input);
    local_58._0_4_ = local_80._0_4_;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    while (local_58._0_4_ == ValueSeparator) {
      JsonLexer::nextToken((JsonToken *)local_80,input);
      local_58._0_4_ = local_80._0_4_;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
      if (local_78._M_p != local_68) {
        operator_delete(local_78._M_p);
      }
      parseObjectMember(input,(JsonToken *)local_58,parent);
      JsonLexer::nextToken((JsonToken *)local_80,input);
      local_58._0_4_ = local_80._0_4_;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
      if (local_78._M_p != local_68) {
        operator_delete(local_78._M_p);
      }
    }
    if (local_58._0_4_ != EndObject) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Could not read the end of the object");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void JsonParser::parseObject(std::istream &input, JsonObject &parent)
    {
        JsonToken current = JsonLexer::nextToken(input);

        if (current.type == JsonTokenType::EndObject)
            return;

        parseObjectMember(input, current, parent);
        current = JsonLexer::nextToken(input);

        while (current.type == JsonTokenType::ValueSeparator)
        {
            current = JsonLexer::nextToken(input);
            parseObjectMember(input, current, parent);
            current = JsonLexer::nextToken(input);
        }

        if (current.type != JsonTokenType::EndObject)
            throw std::runtime_error("Could not read the end of the object");
    }